

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::hasBlocks
          (ChainImpl *this,uint256 *block_hash,int min_height,optional<int> max_height)

{
  ChainstateManager *pCVar1;
  CBlockIndex *this_00;
  uint uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x289,false);
  pCVar1 = chainman(this);
  this_00 = BlockManager::LookupBlockIndex(&pCVar1->m_blockman,block_hash);
  if (this_00 == (CBlockIndex *)0x0) {
    bVar3 = false;
  }
  else {
    if ((((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> >> 0x20 & 1) != 0) &&
       (max_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_payload <= this_00->nHeight)) {
      this_00 = CBlockIndex::GetAncestor
                          (this_00,max_height.super__Optional_base<int,_true,_true>._M_payload.
                                   super__Optional_payload_base<int>._M_payload);
    }
    do {
      uVar2 = this_00->nStatus & 8;
      bVar3 = SUB41(uVar2 >> 3,0);
      if ((uVar2 == 0) || (this_00->nHeight <= min_height)) break;
      this_00 = this_00->pprev;
    } while (this_00 != (CBlockIndex *)0x0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool hasBlocks(const uint256& block_hash, int min_height, std::optional<int> max_height) override
    {
        // hasBlocks returns true if all ancestors of block_hash in specified
        // range have block data (are not pruned), false if any ancestors in
        // specified range are missing data.
        //
        // For simplicity and robustness, min_height and max_height are only
        // used to limit the range, and passing min_height that's too low or
        // max_height that's too high will not crash or change the result.
        LOCK(::cs_main);
        if (const CBlockIndex* block = chainman().m_blockman.LookupBlockIndex(block_hash)) {
            if (max_height && block->nHeight >= *max_height) block = block->GetAncestor(*max_height);
            for (; block->nStatus & BLOCK_HAVE_DATA; block = block->pprev) {
                // Check pprev to not segfault if min_height is too low
                if (block->nHeight <= min_height || !block->pprev) return true;
            }
        }
        return false;
    }